

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O0

void yin_print_anydata(lyout *out,int level,lys_node *node)

{
  int iVar1;
  lys_node *plVar2;
  char *elem_name;
  char *name;
  lys_node_anydata *any;
  int content;
  int i;
  lys_node *node_local;
  lyout *plStack_10;
  int level_local;
  lyout *out_local;
  
  any._0_4_ = 0;
  _content = node;
  node_local._4_4_ = level;
  plStack_10 = out;
  plVar2 = lys_parent(node);
  if (((plVar2 != (lys_node *)0x0) || (iVar1 = strcmp(_content->name,"config"), iVar1 != 0)) ||
     (iVar1 = strcmp(_content->module->name,"ietf-netconf"), iVar1 != 0)) {
    elem_name = "anydata";
    if (node->nodetype == LYS_ANYXML) {
      elem_name = "anyxml";
    }
    yin_print_open(plStack_10,node_local._4_4_,(char *)0x0,elem_name,"name",node->name,(int)any);
    node_local._4_4_ = node_local._4_4_ + 1;
    yin_print_snode_common(plStack_10,node_local._4_4_,_content,_content->module,(int *)&any,1);
    if (node[1].name != (char *)0x0) {
      yin_print_close_parent(plStack_10,(int *)&any);
      yin_print_when(plStack_10,node_local._4_4_,_content->module,(lys_when *)node[1].name);
    }
    for (any._4_4_ = 0; any._4_4_ < (int)(uint)node->iffeature_size; any._4_4_ = any._4_4_ + 1) {
      yin_print_close_parent(plStack_10,(int *)&any);
      yin_print_iffeature(plStack_10,node_local._4_4_,_content->module,node->iffeature + any._4_4_);
    }
    for (any._4_4_ = 0; any._4_4_ < (int)(uint)node->padding[3]; any._4_4_ = any._4_4_ + 1) {
      yin_print_close_parent(plStack_10,(int *)&any);
      yin_print_must(plStack_10,node_local._4_4_,_content->module,
                     (lys_restr *)(node[1].dsc + (long)any._4_4_ * 0x38));
    }
    yin_print_snode_common(plStack_10,node_local._4_4_,_content,_content->module,(int *)&any,0x7c);
    node_local._4_4_ = node_local._4_4_ + -1;
    yin_print_close(plStack_10,node_local._4_4_,(char *)0x0,elem_name,(int)any);
  }
  return;
}

Assistant:

static void
yin_print_anydata(struct lyout *out, int level, const struct lys_node *node)
{
    int i, content = 0;
    struct lys_node_anydata *any = (struct lys_node_anydata *)node;
    const char *name;

    if (!lys_parent(node) && !strcmp(node->name, "config") && !strcmp(node->module->name, "ietf-netconf")) {
        /* node added by libyang, not actually in the model */
        return;
    }

    name = any->nodetype == LYS_ANYXML ? "anyxml" : "anydata";
    yin_print_open(out, level, NULL, name, "name", any->name, content);

    level++;
    yin_print_snode_common(out, level, node, node->module, &content, SNODE_COMMON_EXT);
    if (any->when) {
        yin_print_close_parent(out, &content);
        yin_print_when(out, level, node->module, any->when);
    }
    for (i = 0; i < any->iffeature_size; i++) {
        yin_print_close_parent(out, &content);
        yin_print_iffeature(out, level, node->module, &any->iffeature[i]);
    }
    for (i = 0; i < any->must_size; i++) {
        yin_print_close_parent(out, &content);
        yin_print_must(out, level, node->module, &any->must[i]);
    }
    yin_print_snode_common(out, level, node, node->module, &content, SNODE_COMMON_CONFIG | SNODE_COMMON_MAND |
                           SNODE_COMMON_STATUS | SNODE_COMMON_DSC | SNODE_COMMON_REF);

    level--;
    yin_print_close(out, level, NULL, name, content);
}